

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O1

void __thiscall IZDeflate::ct_init(IZDeflate *this,ush *attr,int *method)

{
  ush uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  this->file_type = attr;
  this->file_method = method;
  this->cmpr_bytelen = 0;
  this->cmpr_len_bits = 0;
  lVar4 = 0;
  iVar6 = 0;
  do {
    this->base_length[lVar4] = iVar6;
    if (this->extra_lbits[lVar4] != 0x1f) {
      lVar9 = 0;
      do {
        this->length_code[lVar9 + iVar6] = (uch)lVar4;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < 1 << ((byte)this->extra_lbits[lVar4] & 0x1f));
      iVar6 = iVar6 + (int)lVar9;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1c);
  this->length_code[(long)iVar6 + -1] = '\x1c';
  lVar4 = 0;
  iVar6 = 0;
  do {
    this->base_dist[lVar4] = iVar6;
    if (this->extra_dbits[lVar4] != 0x1f) {
      lVar9 = 0;
      do {
        this->dist_code[lVar9 + iVar6] = (uch)lVar4;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < 1 << ((byte)this->extra_dbits[lVar4] & 0x1f));
      iVar6 = iVar6 + (int)lVar9;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  iVar6 = iVar6 >> 7;
  lVar4 = 0x10;
  do {
    this->base_dist[lVar4] = iVar6 << 7;
    if (this->extra_dbits[lVar4] != 0x26) {
      lVar9 = 0;
      do {
        this->dist_code[lVar9 + iVar6 + 0x100] = (uch)lVar4;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < 1 << ((char)this->extra_dbits[lVar4] - 7U & 0x1f));
      iVar6 = iVar6 + (int)lVar9;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1e);
  this->bl_count[8] = 0;
  this->bl_count[9] = 0;
  this->bl_count[10] = 0;
  this->bl_count[0xb] = 0;
  this->bl_count[0xc] = 0;
  this->bl_count[0xd] = 0;
  this->bl_count[0xe] = 0;
  this->bl_count[0xf] = 0;
  this->bl_count[0] = 0;
  this->bl_count[1] = 0;
  this->bl_count[2] = 0;
  this->bl_count[3] = 0;
  this->bl_count[4] = 0;
  this->bl_count[5] = 0;
  this->bl_count[6] = 0;
  this->bl_count[7] = 0;
  uVar1 = this->bl_count[8];
  lVar4 = 0xb22;
  do {
    *(undefined2 *)((long)this->extra_lbits + lVar4) = 8;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xd62);
  this->bl_count[8] = uVar1 + 0x90;
  lVar4 = 0xd62;
  do {
    *(undefined2 *)((long)this->extra_lbits + lVar4) = 9;
    this->bl_count[9] = this->bl_count[9] + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xf22);
  lVar4 = 0xf22;
  do {
    *(undefined2 *)((long)this->extra_lbits + lVar4) = 7;
    this->bl_count[7] = this->bl_count[7] + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xf82);
  uVar1 = this->bl_count[8];
  lVar4 = 0xf82;
  do {
    *(undefined2 *)((long)this->extra_lbits + lVar4) = 8;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xfa2);
  this->bl_count[8] = uVar1 + 8;
  gen_codes(this,this->static_ltree,0x11f);
  uVar2 = 0;
  do {
    this->static_dtree[uVar2].dl.dad = 5;
    uVar3 = 6;
    uVar5 = uVar2 & 0xffffffff;
    uVar8 = 0;
    do {
      uVar7 = (uint)uVar5 & 1 | uVar8;
      uVar5 = uVar5 >> 1;
      uVar8 = uVar7 * 2;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    this->static_dtree[uVar2].fc.freq = (ush)uVar7;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x1e);
  lVar4 = 0x4e;
  do {
    *(undefined2 *)(this->extra_lbits + lVar4) = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x16c);
  lVar4 = 0;
  do {
    this->dyn_dtree[lVar4].fc.freq = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1e);
  lVar4 = 0;
  do {
    this->bl_tree[lVar4].fc.freq = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x13);
  this->dyn_ltree[0x100].fc.freq = 1;
  this->last_lit = 0;
  this->last_dist = 0;
  *(undefined8 *)((long)&this->last_dist + 1) = 0;
  this->opt_len = 0;
  this->static_len = 0;
  this->flag_bit = '\x01';
  return;
}

Assistant:

void IZDeflate::ct_init(ush *attr, int * method)
    // ush  *attr;   /* pointer to internal file attribute */
    // int  *method; /* pointer to compression method */
{
    int n;        /* iterates over tree elements */
    int bits;     /* bit counter */
    int length;   /* length value */
    int code;     /* code value */
    int dist;     /* distance index */

    file_type = attr;
    file_method = method;
    cmpr_len_bits = 0L;
    cmpr_bytelen = (uzoff_t)0;
#ifdef DEBUG
    input_len = (uzoff_t)0;
#endif

#if 0
// READ OF UNITIALIZED MEM!
    if (static_dtree[0].Len != 0) return; /* ct_init already called */
#endif

#ifdef DYN_ALLOC
    d_buf = (ush *) zcalloc(DIST_BUFSIZE, sizeof(ush));
    l_buf = (uch *) zcalloc(LIT_BUFSIZE/2, 2);
    /* Avoid using the value 64K on 16 bit machines */
    if (l_buf == NULL || d_buf == NULL)
        ziperr(ZE_MEM, "ct_init: out of memory");
#endif

    /* Initialize the mapping length (0..255) -> length code (0..28) */
    length = 0;
    for (code = 0; code < LENGTH_CODES-1; code++) {
        base_length[code] = length;
        for (n = 0; n < (1<<extra_lbits[code]); n++) {
            length_code[length++] = (uch)code;
        }
    }
    Assert(length == 256, "ct_init: length != 256");
    /* Note that the length 255 (match length 258) can be represented
     * in two different ways: code 284 + 5 bits or code 285, so we
     * overwrite length_code[255] to use the best encoding:
     */
    length_code[length-1] = (uch)code;

    /* Initialize the mapping dist (0..32K) -> dist code (0..29) */
    dist = 0;
    for (code = 0 ; code < 16; code++) {
        base_dist[code] = dist;
        for (n = 0; n < (1<<extra_dbits[code]); n++) {
            dist_code[dist++] = (uch)code;
        }
    }
    Assert(dist == 256, "ct_init: dist != 256");
    dist >>= 7; /* from now on, all distances are divided by 128 */
    for ( ; code < D_CODES; code++) {
        base_dist[code] = dist << 7;
        for (n = 0; n < (1<<(extra_dbits[code]-7)); n++) {
            dist_code[256 + dist++] = (uch)code;
        }
    }
    Assert(dist == 256, "ct_init: 256+dist != 512");

    /* Construct the codes of the static literal tree */
    for (bits = 0; bits <= MAX_BITS; bits++) bl_count[bits] = 0;
    n = 0;
    while (n <= 143) static_ltree[n++].Len = 8, bl_count[8]++;
    while (n <= 255) static_ltree[n++].Len = 9, bl_count[9]++;
    while (n <= 279) static_ltree[n++].Len = 7, bl_count[7]++;
    while (n <= 287) static_ltree[n++].Len = 8, bl_count[8]++;
    /* Codes 286 and 287 do not exist, but we must include them in the
     * tree construction to get a canonical Huffman tree (longest code
     * all ones)
     */
    gen_codes((ct_data near *)static_ltree, L_CODES+1);

    /* The static distance tree is trivial: */
    for (n = 0; n < D_CODES; n++) {
        static_dtree[n].Len = 5;
        static_dtree[n].Code = (ush)bi_reverse(n, 5);
    }

    /* Initialize the first block of the first file: */
    init_block();
}